

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_append.c
# Opt level: O0

void * mpt_array_append(mpt_array *arr,size_t len,void *base)

{
  int *piVar1;
  void *__s;
  void *dest;
  size_t used;
  mpt_buffer *b;
  void *base_local;
  size_t len_local;
  mpt_array *arr_local;
  
  used = (size_t)arr->_buf;
  if ((mpt_buffer *)used == (mpt_buffer *)0x0) {
    used = (size_t)_mpt_buffer_alloc(len,0);
    if ((mpt_buffer *)used == (mpt_buffer *)0x0) {
      return (void *)0x0;
    }
    dest = (void *)0x0;
    arr->_buf = (mpt_buffer *)used;
  }
  else {
    if (((mpt_buffer *)used)->_content_traits != (mpt_type_traits *)0x0) {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      return (void *)0x0;
    }
    dest = (void *)((mpt_buffer *)used)->_used;
    if (((mpt_buffer *)used)->_size - (long)dest < len) {
      if (-(long)dest - 1U < len) {
        piVar1 = __errno_location();
        *piVar1 = 0x16;
        return (void *)0x0;
      }
      used = (size_t)(*((mpt_buffer *)used)->_vptr->detach)((mpt_buffer *)used,(long)dest + len);
      if ((mpt_buffer *)used == (mpt_buffer *)0x0) {
        return (void *)0x0;
      }
      arr->_buf = (mpt_buffer *)used;
    }
  }
  __s = (void *)(used + 0x20 + (long)dest);
  if (len != 0) {
    *(size_t *)(used + 0x18) = (long)dest + len;
    if (base == (void *)0x0) {
      memset(__s,0,len);
    }
    else {
      memcpy(__s,base,len);
    }
  }
  return __s;
}

Assistant:

extern void *mpt_array_append(MPT_STRUCT(array) *arr, size_t len, const void *base)
{
	MPT_STRUCT(buffer) *b;
	size_t used;
	void *dest;
	
	if (!(b = arr->_buf)) {
		if (!(b = _mpt_buffer_alloc(len, 0))) {
			return 0;
		}
		used = 0;
		arr->_buf = b;
	}
	/* require raw buffer to append data */
	else if (b->_content_traits) {
		errno = EINVAL;
		return 0;
	}
	/* need more space */
	else if (len > (b->_size - (used = b->_used))) {
		if (len > (SIZE_MAX - used)) {
			errno = EINVAL;
			return 0;
		}
		if (!(b = b->_vptr->detach(b, used + len))) {
			return 0;
		}
		arr->_buf = b;
	}
	dest = ((uint8_t *)(b + 1)) + used;
	if (!len) {
		return dest;
	}
	
	b->_used = used + len;
	
	if (base) {
		memcpy(dest, base, len);
	} else {
		memset(dest, 0, len);
	}
	return dest;
}